

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

bool __thiscall RenX_Ladder_WebPlugin::initialize(RenX_Ladder_WebPlugin *this)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  puVar1 = &this->field_0x38;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0xe,"LadderPageName",0,"");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->ladder_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0xe,"SearchPageName",6,"search");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->search_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,0xf,"ProfilePageName",7,"profile");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->profile_page_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,8,"Hostname",0,"");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->web_hostname,
             (basic_string_view<char,_std::char_traits<char>_> *)&content);
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )Jupiter::Config::get(puVar1,4,"Path",1,"/");
  __svt = (basic_string_view<char,_std::char_traits<char>_> *)&content;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->web_path,__svt);
  init(this,(EVP_PKEY_CTX *)__svt);
  uVar3 = getHTTPServer();
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&content,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->ladder_page_name);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x112842;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) = 9;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x58) =
       0x112845;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x11284f;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  local_40._8_8_ =
       content._M_t.
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)(local_40 + 8));
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->search_page_name);
  uVar2 = local_50._0_8_;
  local_50._0_8_ = (pointer)0x0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)uVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_50);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x112842;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) = 9;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x58) =
       0x112845;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x11284f;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  local_40._0_8_ =
       content._M_t.
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_40);
  std::
  make_unique<Jupiter::HTTP::Server::Content,std::__cxx11::string&,std::__cxx11::string*(&)(std::basic_string_view<char,std::char_traits<char>>)>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string_view<char,_std::char_traits<char>_>
              *)&this->profile_page_name);
  uVar2 = local_50._0_8_;
  local_50._0_8_ = 0;
  std::
  __uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ::reset((__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
           *)&content,(pointer)uVar2);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)local_50);
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x40) = 2;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x48) =
       0x112842;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x50) = 9;
  *(undefined8 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x58) =
       0x112845;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x60) = 5;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 100) = 0;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x68) =
       0x11284f;
  *(undefined4 *)
   ((long)content._M_t.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl + 0x6c) = 0;
  local_50._8_8_ =
       content._M_t.
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  content._M_t.
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
       (__uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
        )(__uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          )0x0;
  Jupiter::HTTP::Server::hook
            (uVar3,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr((unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               *)(local_50 + 8));
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&content);
  return true;
}

Assistant:

bool RenX_Ladder_WebPlugin::initialize() {
	RenX_Ladder_WebPlugin::ladder_page_name = this->config.get("LadderPageName"sv, ""sv);
	RenX_Ladder_WebPlugin::search_page_name = this->config.get("SearchPageName"sv, "search"sv);
	RenX_Ladder_WebPlugin::profile_page_name = this->config.get("ProfilePageName"sv, "profile"sv);
	RenX_Ladder_WebPlugin::web_hostname = this->config.get("Hostname"sv, ""sv);
	RenX_Ladder_WebPlugin::web_path = this->config.get("Path"sv, "/"sv);

	this->init();

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::ladder_page_name, handle_ladder_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::search_page_name, handle_search_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::profile_page_name, handle_profile_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	return true;
}